

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

Matcher<fmt::v5::basic_string_view<wchar_t>_> *
testing::A<fmt::v5::basic_string_view<wchar_t>>(void)

{
  void *__s;
  Matcher<fmt::v5::basic_string_view<wchar_t>_> *in_RDI;
  MatcherInterface<fmt::v5::basic_string_view<wchar_t>_> *in_stack_ffffffffffffffd8;
  Matcher<fmt::v5::basic_string_view<wchar_t>_> *this;
  
  this = in_RDI;
  __s = operator_new(8);
  memset(__s,0,8);
  internal::AnyMatcherImpl<fmt::v5::basic_string_view<wchar_t>_>::AnyMatcherImpl
            ((AnyMatcherImpl<fmt::v5::basic_string_view<wchar_t>_> *)this);
  MakeMatcher<fmt::v5::basic_string_view<wchar_t>>(in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }